

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_concat::build_graph(test_concat *this,ggml_context *ctx)

{
  value_type_conflict3 vVar1;
  value_type_conflict3 vVar2;
  value_type_conflict3 vVar3;
  reference pvVar4;
  ggml_tensor *pgVar5;
  const_reference pvVar6;
  test_case *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  array<long,_4UL> ne_1;
  ggml_tensor *b;
  array<long,_4UL> ne;
  ggml_tensor *a;
  array<long,_4UL> ne_b;
  size_t in_stack_fffffffffffffea8;
  array<long,_4UL> *in_stack_fffffffffffffeb0;
  int64_t *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ggml_context *in_stack_fffffffffffffec8;
  test_case *in_stack_fffffffffffffed0;
  test_case *this_00;
  ggml_tensor *local_68;
  ggml_tensor *local_40;
  
  vVar1 = *(value_type_conflict3 *)(in_RDI + 0x60);
  pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  *pvVar4 = vVar1;
  if ((*(uint *)(in_RDI + 0x6c) & 1) == 0) {
    std::array<long,_4UL>::data((array<long,_4UL> *)0x15ff8b);
    local_40 = test_case::ggml_new_tensor
                         (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                          (ggml_type)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                          (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    ggml_set_name(local_40,"a");
  }
  else {
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *pvVar4 = *pvVar4 << 1;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *pvVar4 = *pvVar4 << 2;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *pvVar4 = *pvVar4 * 3;
    std::array<long,_4UL>::data((array<long,_4UL> *)0x15fe03);
    pgVar5 = test_case::ggml_new_tensor
                       (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                        (ggml_type)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                        (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    ggml_set_name(pgVar5,"a");
    pvVar6 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    vVar1 = *pvVar6;
    pvVar6 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    vVar2 = *pvVar6;
    pvVar6 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    vVar3 = *pvVar6;
    pvVar6 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffea8 = pgVar5->nb[1];
    in_stack_fffffffffffffeb0 = (array<long,_4UL> *)pgVar5->nb[2];
    in_stack_fffffffffffffeb8 = (int64_t *)pgVar5->nb[3];
    in_stack_fffffffffffffec0 = 0;
    local_40 = (ggml_tensor *)ggml_view_4d(in_RSI,pgVar5,vVar1,vVar2,vVar3,*pvVar6);
    ggml_set_name(local_40,"view_of_a");
  }
  if ((*(uint *)(in_RDI + 0x6c) & 2) == 0) {
    this_00 = in_RSI;
    std::array<long,_4UL>::data((array<long,_4UL> *)0x1601ef);
    local_68 = test_case::ggml_new_tensor
                         (this_00,in_stack_fffffffffffffec8,
                          (ggml_type)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                          (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    ggml_set_name(local_68,"b");
  }
  else {
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *pvVar4 = *pvVar4 * 3;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *pvVar4 = *pvVar4 << 1;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    *pvVar4 = *pvVar4 << 2;
    std::array<long,_4UL>::data((array<long,_4UL> *)0x160097);
    pgVar5 = test_case::ggml_new_tensor
                       (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                        (ggml_type)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                        (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    ggml_set_name(pgVar5,"b");
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    vVar1 = *pvVar4;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    vVar2 = *pvVar4;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    vVar3 = *pvVar4;
    pvVar4 = std::array<long,_4UL>::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_68 = (ggml_tensor *)
               ggml_view_4d(in_RSI,pgVar5,vVar1,vVar2,vVar3,*pvVar4,pgVar5->nb[1],pgVar5->nb[2],
                            pgVar5->nb[3],0);
    ggml_set_name(local_68,"view_of_b");
  }
  pgVar5 = (ggml_tensor *)ggml_concat(in_RSI,local_40,local_68,*(undefined4 *)(in_RDI + 0x68));
  ggml_set_name(pgVar5,"out");
  return pgVar5;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        auto ne_b = ne_a;
        ne_b[dim] = ne_b_d;
        ggml_tensor * a;
        if (v & 1) {
            auto ne = ne_a; ne[0] *= 2; ne[1] *= 4; ne[2] *= 3;
            a = ggml_new_tensor(ctx, type, 4, ne.data());
            ggml_set_name(a, "a");

            a = ggml_view_4d(ctx, a, ne_a[0], ne_a[1], ne_a[2], ne_a[3], a->nb[1], a->nb[2], a->nb[3], 0);
            ggml_set_name(a, "view_of_a");
        } else {
            a = ggml_new_tensor(ctx, type, 4, ne_a.data());
            ggml_set_name(a, "a");
        }
        ggml_tensor * b;
        if (v & 2) {
            auto ne = ne_b; ne[0] *= 3; ne[1] *= 2; ne[2] *= 4;
            b = ggml_new_tensor(ctx, type, 4, ne.data());
            ggml_set_name(b, "b");

            b = ggml_view_4d(ctx, b, ne_b[0], ne_b[1], ne_b[2], ne_b[3], b->nb[1], b->nb[2], b->nb[3], 0);
            ggml_set_name(b, "view_of_b");
        } else {
            b = ggml_new_tensor(ctx, type, 4, ne_b.data());
            ggml_set_name(b, "b");
        }

        ggml_tensor * out = ggml_concat(ctx, a, b, dim);
        ggml_set_name(out, "out");

        return out;
    }